

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::CreateShader::exec(CreateShader *this,Thread *t)

{
  ostream *poVar1;
  GLuint GVar2;
  deUint32 err;
  Thread *pTVar3;
  undefined1 local_1b8 [136];
  ios_base local_130 [264];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    local_1b8._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glCreateShader(",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    GVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x3f0))(this->m_type);
    err = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"glCreateShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x552);
    local_1b8._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = glCreateShader(",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    ((this->m_shader).m_ptr)->shader = GVar2;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void CreateShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint shader = 0;

	thread.newMessage() << "Begin -- glCreateShader(" << m_type << ")" << tcu::ThreadUtil::Message::End;
	shader = thread.gl.createShader(m_type);
	GLU_CHECK_GLW_MSG(thread.gl, "glCreateShader()");
	thread.newMessage() << "End -- " << shader  << " = glCreateShader(" << m_type << ")" << tcu::ThreadUtil::Message::End;

	m_shader->shader	= shader;
}